

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::Compiler::type_struct_member_array_stride(Compiler *this,SPIRType *type,uint32_t index)

{
  Meta *pMVar1;
  runtime_error *prVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pMVar1 = ParsedIR::find_meta(&this->ir,
                               (ID)(type->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                   ptr[index].id);
  if (pMVar1 == (Meta *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Struct member does not have ArrayStride set.","");
    ::std::runtime_error::runtime_error(prVar2,(string *)local_40);
    *(undefined ***)prVar2 = &PTR__runtime_error_003f8e68;
    __cxa_throw(prVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (((pMVar1->decoration).decoration_flags.lower & 0x40) != 0) {
    return (pMVar1->decoration).array_stride;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Struct member does not have ArrayStride set.","");
  ::std::runtime_error::runtime_error(prVar2,(string *)local_40);
  *(undefined ***)prVar2 = &PTR__runtime_error_003f8e68;
  __cxa_throw(prVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

uint32_t Compiler::type_struct_member_array_stride(const SPIRType &type, uint32_t index) const
{
	auto *type_meta = ir.find_meta(type.member_types[index]);
	if (type_meta)
	{
		// Decoration must be set in valid SPIR-V, otherwise throw.
		// ArrayStride is part of the array type not OpMemberDecorate.
		auto &dec = type_meta->decoration;
		if (dec.decoration_flags.get(DecorationArrayStride))
			return dec.array_stride;
		else
			SPIRV_CROSS_THROW("Struct member does not have ArrayStride set.");
	}
	else
		SPIRV_CROSS_THROW("Struct member does not have ArrayStride set.");
}